

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O3

bool checkOutput(istream *outputStream,istream *errorStream)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  string error;
  string output;
  string local_50;
  string local_30;
  
  getInput_abi_cxx11_(&local_30,outputStream);
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Output was \"",0xc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", expected \"HELO WRD!\"",0x17);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar4 = false;
    goto LAB_001daffc;
  }
  getInput_abi_cxx11_(&local_50,errorStream);
  lVar3 = std::__cxx11::string::find((char *)&local_50,0x8f1567,0);
  if (lVar3 != -1) {
    std::__cxx11::string::resize((ulong)&local_50,(char)lVar3);
  }
  if (local_50._M_string_length == 3) {
    lVar3 = std::__cxx11::string::find((char)&local_50,0x31);
    if (lVar3 == -1) goto LAB_001daf73;
    lVar3 = std::__cxx11::string::find((char)&local_50,0x32);
    if (lVar3 == -1) goto LAB_001daf73;
    lVar3 = std::__cxx11::string::find((char)&local_50,0x33);
    bVar4 = true;
    if (lVar3 == -1) goto LAB_001daf73;
  }
  else {
LAB_001daf73:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error was \"",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", expected \"123\"",0x11);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_001daffc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

static bool checkOutput(std::istream& outputStream, std::istream& errorStream)
{
  std::string output = getInput(outputStream);
  if (output != "HELO WRD!") {
    std::cout << "Output was \"" << output << "\", expected \"HELO WRD!\""
              << std::endl;
    return false;
  }

  std::string error = getInput(errorStream);
  auto qemu_error_pos = error.find("qemu:");
  if (qemu_error_pos != std::string::npos) {
    error.resize(qemu_error_pos);
  }
  if (error.length() != 3 || error.find('1') == std::string::npos ||
      error.find('2') == std::string::npos ||
      error.find('3') == std::string::npos) {
    std::cout << "Error was \"" << error << "\", expected \"123\""
              << std::endl;
    return false;
  }

  return true;
}